

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

bool absl::Condition::GuaranteedEqual(Condition *a,Condition *b)

{
  _func_bool_Condition_ptr *p_Var1;
  
  if (a == (Condition *)0x0) {
    if (b == (Condition *)0x0) {
      return true;
    }
    p_Var1 = b->eval_;
  }
  else {
    if ((b != (Condition *)0x0) && (b->eval_ != (_func_bool_Condition_ptr *)0x0)) {
      if (((a->eval_ == b->eval_) && (a->function_ == b->function_)) && (a->arg_ == b->arg_)) {
        return (*(long *)&a->field_0x18 == *(long *)&b->field_0x18 || a->method_ == 0) &&
               a->method_ == b->method_;
      }
      return false;
    }
    p_Var1 = a->eval_;
  }
  return p_Var1 == (_func_bool_Condition_ptr *)0x0;
}

Assistant:

bool Condition::GuaranteedEqual(const Condition *a, const Condition *b) {
  if (a == nullptr) {
    return b == nullptr || b->eval_ == nullptr;
  }
  if (b == nullptr || b->eval_ == nullptr) {
    return a->eval_ == nullptr;
  }
  return a->eval_ == b->eval_ && a->function_ == b->function_ &&
         a->arg_ == b->arg_ && a->method_ == b->method_;
}